

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O3

void deqp::anon_unknown_13::setUniform
               (Functions *gl,deUint32 programID,char *name,float *value,int arraySize)

{
  GLint GVar1;
  GLenum err;
  long *plVar2;
  long *plVar3;
  long *msg;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  GVar1 = (*gl->getUniformLocation)(programID,"s.b");
  (*gl->uniform1fv)(GVar1,3,(GLfloat *)name);
  err = (*gl->getError)();
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Failed to set ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    msg = &local_50;
  }
  else {
    local_50 = *plVar3;
    msg = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  glu::checkError(err,(char *)msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderStructTests.cpp"
                  ,0x402);
  if (msg != &local_50) {
    operator_delete(msg,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void setUniform(const glw::Functions& gl, deUint32 programID, const char* name, const float* value, int arraySize)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1fv(loc, arraySize, value);
	CHECK_SET_UNIFORM(name);
}